

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O1

void asio::detail::executor_function::
     complete<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>,asio::ssl::detail::handshake_op,std::_Bind<void(nuraft::rpc_session::*(nuraft::rpc_session*,std::shared_ptr<nuraft::rpc_session>,std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,std::error_code_const&)>>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  error_code ec;
  allocator<void> allocator;
  ptr p;
  allocator<void> local_91;
  ptr local_90;
  undefined1 local_78 [24];
  want local_60;
  _func_void_impl_base_ptr_bool *local_58;
  error_category *peStack_50;
  _func_void_impl_base_ptr_bool *local_48;
  _func_void_impl_base_ptr_bool *p_Stack_40;
  _func_void_impl_base_ptr_bool *local_38;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  _Head_base<0UL,_nuraft::rpc_session_*,_false> local_20;
  _func_void_impl_base_ptr_bool *local_18;
  error_category *peStack_10;
  
  local_90.a = &local_91;
  local_78._0_8_ = base[1].complete_;
  local_78._8_8_ = base[2].complete_;
  local_78._16_8_ = base[3].complete_;
  local_60 = *(want *)&base[4].complete_;
  local_58 = base[5].complete_;
  peStack_50 = (error_category *)base[6].complete_;
  local_38 = base[9].complete_;
  local_48 = base[7].complete_;
  p_Stack_40 = base[8].complete_;
  local_30 = (element_type *)base[10].complete_;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)base[0xb].complete_;
  base[0xb].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  base[10].complete_ = (_func_void_impl_base_ptr_bool *)0x0;
  local_20._M_head_impl = (rpc_session *)base[0xc].complete_;
  local_18 = base[0xd].complete_;
  peStack_10 = (error_category *)base[0xe].complete_;
  local_90.v = base;
  local_90.p = (impl<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_90);
  if (call) {
    ec._0_8_ = (ulong)local_18 & 0xffffffff;
    ec._M_cat = peStack_10;
    asio::ssl::detail::
    io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
    ::operator()((io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>
                  *)local_78,ec,0xffffffffffffffff,0);
  }
  if (_Stack_28._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_28._M_pi);
  }
  impl<asio::detail::binder1<asio::ssl::detail::io_op<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::ssl::detail::handshake_op,_std::_Bind<void_(nuraft::rpc_session::*(nuraft::rpc_session_*,_std::shared_ptr<nuraft::rpc_session>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::rpc_session>,_const_std::error_code_&)>_>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_90);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }